

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slgh_compile.cc
# Opt level: O1

bool __thiscall
ConsistencyChecker::checkVarnodeTruncation
          (ConsistencyChecker *this,Constructor *ct,int4 slot,OpTpl *op,VarnodeTpl *vn,
          bool isbigendian)

{
  char cVar1;
  int4 iVar2;
  bool bVar3;
  undefined7 in_register_00000089;
  string local_50;
  
  bVar3 = true;
  if ((*(int *)(vn + 0x20) == 1) && (*(int *)(vn + 0x38) == 3)) {
    if (*(uint *)(vn + 0x40) < 2) {
      iVar2 = recoverSize(this,(ConstTpl *)(vn + 0x20),ct);
      if (0 < iVar2) {
        cVar1 = VarnodeTpl::adjustTruncation((int)vn,SUB41(iVar2,0));
        if (cVar1 != '\0') {
          return (bool)cVar1;
        }
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Truncation operator out of bounds","");
        printOpError(this,op,ct,slot,slot,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p == &local_50.field_2) {
          return false;
        }
        operator_delete(local_50._M_dataplus._M_p);
        return false;
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Could not recover size","");
      printOpError(this,op,ct,slot,slot,&local_50);
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Bad truncation expression","",op,vn,
                 CONCAT71(in_register_00000089,isbigendian));
      printOpError(this,op,ct,slot,slot,&local_50);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ConsistencyChecker::checkVarnodeTruncation(Constructor *ct,int4 slot,
						OpTpl *op,VarnodeTpl *vn,bool isbigendian)
{
  const ConstTpl &off( vn->getOffset() );
  if (off.getType() != ConstTpl::handle) return true;
  if (off.getSelect() != ConstTpl::v_offset_plus) return true;
  ConstTpl::const_type sztype = vn->getSize().getType();
  if ((sztype != ConstTpl::real)&&(sztype != ConstTpl::handle)) {
    printOpError(op,ct,slot,slot,"Bad truncation expression");
    return false;
  }
  int4 sz = recoverSize(off,ct); // Recover the size of the original operand
  if (sz <= 0) {
    printOpError(op,ct,slot,slot,"Could not recover size");
    return false;
  }
  bool res = vn->adjustTruncation(sz,isbigendian);
  if (!res) {
    printOpError(op,ct,slot,slot,"Truncation operator out of bounds");
    return false;
  }
  return true;
}